

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O1

char * server::getdemofile(char *file,bool init)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  char *path;
  char *pcVar4;
  
  if (*demodir == '\0') {
    pcVar4 = (char *)0x0;
  }
  else {
    pcVar4 = getdemofile::buf;
    strncpy(getdemofile::buf,demodir,0x104);
    getdemofile::buf[0x103] = '\0';
    sVar3 = strlen(getdemofile::buf);
    iVar2 = (int)sVar3;
    if (((getdemofile::buf[iVar2] != '/') && (getdemofile::buf[iVar2] != '\\')) && (iVar2 < 0x103))
    {
      getdemofile::buf[iVar2] = '/';
      getdemofile::buf[(long)((sVar3 << 0x20) + 0x100000000) >> 0x20] = '\0';
    }
    if (init) {
      path = findfile(getdemofile::buf,"w");
      bVar1 = fileexists(path,"w");
      if (!bVar1) {
        createdir(path);
      }
    }
    sVar3 = strlen(getdemofile::buf);
    if (sVar3 < 0x104) {
      pcVar4 = getdemofile::buf;
      strncpy(getdemofile::buf + sVar3,file,0x104 - sVar3);
      getdemofile::buf[0x103] = '\0';
    }
  }
  return pcVar4;
}

Assistant:

const char *getdemofile(const char *file, bool init)
    {
        if(!demodir[0]) return NULL;
        static string buf;
        copystring(buf, demodir);
        int dirlen = strlen(buf);
        if(buf[dirlen] != '/' && buf[dirlen] != '\\' && dirlen+1 < (int)sizeof(buf)) { buf[dirlen++] = '/'; buf[dirlen] = '\0'; }
        if(init)
        {
            const char *dir = findfile(buf, "w");
            if(!fileexists(dir, "w")) createdir(dir);
        }
        concatstring(buf, file);
        return buf;
    }